

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_edge_sse4.c
# Opt level: O0

void av1_upsample_intra_edge_sse4_1(uint8_t *p,int sz)

{
  undefined1 auVar1 [16];
  int in_ESI;
  long in_RDI;
  undefined1 in_XMM0 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  __m128i d0;
  __m128i in8;
  __m128i shuf1;
  __m128i shuf0;
  __m128i coef0;
  __m128i in16;
  __m128i in0;
  int n;
  uint8_t *out;
  uint8_t *in;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined1 local_348 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  int local_2ec;
  undefined8 *local_2e8;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  __m128i out1;
  __m128i out0;
  __m128i in1;
  __m128i eight;
  __m128i d3;
  __m128i d2;
  __m128i d1;
  
  *(undefined1 *)(in_RDI + -2) = *(undefined1 *)(in_RDI + -1);
  *(undefined1 *)(in_RDI + in_ESI) = *(undefined1 *)(in_RDI + (in_ESI + -1));
  local_2e8 = (undefined8 *)(in_RDI + -2);
  local_2ec = in_ESI + 1;
  local_308 = lddqu(in_XMM0,*(undefined1 (*) [16])(in_RDI + -2));
  local_318 = lddqu(local_308,*(undefined1 (*) [16])(in_RDI + 0xe));
  auVar2 = lddqu(local_318,(undefined1  [16])av1_upsample_intra_edge_sse4_1::kernel[0]);
  auVar3 = lddqu(auVar2,(undefined1  [16])av1_upsample_intra_edge_sse4_1::v_const[0]);
  local_348 = lddqu(auVar3,(undefined1  [16])av1_upsample_intra_edge_sse4_1::v_const[1]);
  for (; 0 < local_2ec; local_2ec = local_2ec + -0x10) {
    local_348._0_8_ = local_308._0_8_;
    auVar4 = pshufb(local_308,auVar3);
    auVar5._8_8_ = local_348._8_8_;
    auVar5._0_8_ = local_308._0_8_;
    auVar5 = pshufb(local_308,auVar5);
    auVar6._8_8_ = local_308._8_8_;
    auVar6._0_8_ = local_358;
    auVar6 = pshufb(auVar6,auVar3);
    auVar8._8_8_ = local_308._8_8_;
    auVar8._0_8_ = local_358;
    auVar7._8_8_ = local_348._8_8_;
    auVar7._0_8_ = local_308._0_8_;
    auVar7 = pshufb(auVar8,auVar7);
    auVar8 = pmaddubsw(auVar4,auVar2);
    auVar5 = pmaddubsw(auVar5,auVar2);
    auVar6 = pmaddubsw(auVar6,auVar2);
    auVar7 = pmaddubsw(auVar7,auVar2);
    auVar8 = phaddw(auVar8,auVar5);
    auVar7 = phaddw(auVar6,auVar7);
    local_e8 = auVar8._0_2_;
    sStack_e6 = auVar8._2_2_;
    sStack_e4 = auVar8._4_2_;
    sStack_e2 = auVar8._6_2_;
    sStack_e0 = auVar8._8_2_;
    sStack_de = auVar8._10_2_;
    sStack_dc = auVar8._12_2_;
    sStack_da = auVar8._14_2_;
    local_368._0_4_ = CONCAT22(sStack_e6 + 8,local_e8 + 8);
    local_368._0_6_ = CONCAT24(sStack_e4 + 8,(undefined4)local_368);
    local_368 = CONCAT26(sStack_e2 + 8,(undefined6)local_368);
    uStack_360._0_2_ = sStack_e0 + 8;
    uStack_360._2_2_ = sStack_de + 8;
    uStack_360._4_2_ = sStack_dc + 8;
    uStack_360._6_2_ = sStack_da + 8;
    local_108 = auVar7._0_2_;
    sStack_106 = auVar7._2_2_;
    sStack_104 = auVar7._4_2_;
    sStack_102 = auVar7._6_2_;
    sStack_100 = auVar7._8_2_;
    sStack_fe = auVar7._10_2_;
    sStack_fc = auVar7._12_2_;
    sStack_fa = auVar7._14_2_;
    local_388._0_4_ = CONCAT22(sStack_106 + 8,local_108 + 8);
    local_388._0_6_ = CONCAT24(sStack_104 + 8,(undefined4)local_388);
    local_388 = CONCAT26(sStack_102 + 8,(undefined6)local_388);
    uStack_380._0_2_ = sStack_100 + 8;
    uStack_380._2_2_ = sStack_fe + 8;
    uStack_380._4_2_ = sStack_fc + 8;
    uStack_380._6_2_ = sStack_fa + 8;
    auVar1._8_8_ = uStack_360;
    auVar1._0_8_ = local_368;
    auVar7 = psraw(auVar1,ZEXT416(4));
    auVar4._8_8_ = uStack_380;
    auVar4._0_8_ = local_388;
    auVar8 = psraw(auVar4,ZEXT416(4));
    local_88 = auVar7._0_2_;
    sStack_86 = auVar7._2_2_;
    sStack_84 = auVar7._4_2_;
    sStack_82 = auVar7._6_2_;
    sStack_80 = auVar7._8_2_;
    sStack_7e = auVar7._10_2_;
    sStack_7c = auVar7._12_2_;
    sStack_7a = auVar7._14_2_;
    local_98 = auVar8._0_2_;
    sStack_96 = auVar8._2_2_;
    sStack_94 = auVar8._4_2_;
    sStack_92 = auVar8._6_2_;
    sStack_90 = auVar8._8_2_;
    sStack_8e = auVar8._10_2_;
    sStack_8c = auVar8._12_2_;
    sStack_8a = auVar8._14_2_;
    out1[1]._0_1_ = local_308[1];
    out1[1]._1_1_ = local_308[2];
    out1[1]._2_1_ = local_308[3];
    out1[1]._3_1_ = local_308[4];
    out1[1]._4_1_ = local_308[5];
    out1[1]._5_1_ = local_308[6];
    out1[1]._6_1_ = local_308[7];
    out1[1]._7_1_ = local_308[8];
    eight[0]._0_1_ = local_308[9];
    eight[0]._1_1_ = local_308[10];
    eight[0]._2_1_ = local_308[0xb];
    eight[0]._3_1_ = local_308[0xc];
    eight[0]._4_1_ = local_308[0xd];
    eight[0]._5_1_ = local_308[0xe];
    eight[0]._6_1_ = local_308[0xf];
    eight[0]._7_1_ = local_318[0];
    *local_2e8 = CONCAT17((0 < sStack_82) * (sStack_82 < 0x100) * auVar7[6] - (0xff < sStack_82),
                          CONCAT16(out1[1]._3_1_,
                                   CONCAT15((0 < sStack_84) * (sStack_84 < 0x100) * auVar7[4] -
                                            (0xff < sStack_84),
                                            CONCAT14(out1[1]._2_1_,
                                                     CONCAT13((0 < sStack_86) * (sStack_86 < 0x100)
                                                              * auVar7[2] - (0xff < sStack_86),
                                                              CONCAT12(out1[1]._1_1_,
                                                                       CONCAT11((0 < local_88) *
                                                                                (local_88 < 0x100) *
                                                                                auVar7[0] -
                                                                                (0xff < local_88),
                                                                                (undefined1)out1[1])
                                                                      ))))));
    local_2e8[1] = CONCAT17((0 < sStack_7a) * (sStack_7a < 0x100) * auVar7[0xe] - (0xff < sStack_7a)
                            ,CONCAT16(out1[1]._7_1_,
                                      CONCAT15((0 < sStack_7c) * (sStack_7c < 0x100) * auVar7[0xc] -
                                               (0xff < sStack_7c),
                                               CONCAT14(out1[1]._6_1_,
                                                        CONCAT13((0 < sStack_7e) *
                                                                 (sStack_7e < 0x100) * auVar7[10] -
                                                                 (0xff < sStack_7e),
                                                                 CONCAT12(out1[1]._5_1_,
                                                                          CONCAT11((0 < sStack_80) *
                                                                                   (sStack_80 <
                                                                                   0x100) * auVar7[8
                                                  ] - (0xff < sStack_80),out1[1]._4_1_)))))));
    local_2e8[2] = CONCAT17((0 < sStack_92) * (sStack_92 < 0x100) * auVar8[6] - (0xff < sStack_92),
                            CONCAT16(eight[0]._3_1_,
                                     CONCAT15((0 < sStack_94) * (sStack_94 < 0x100) * auVar8[4] -
                                              (0xff < sStack_94),
                                              CONCAT14(eight[0]._2_1_,
                                                       CONCAT13((0 < sStack_96) *
                                                                (sStack_96 < 0x100) * auVar8[2] -
                                                                (0xff < sStack_96),
                                                                CONCAT12(eight[0]._1_1_,
                                                                         CONCAT11((0 < local_98) *
                                                                                  (local_98 < 0x100)
                                                                                  * auVar8[0] -
                                                                                  (0xff < local_98),
                                                                                  (undefined1)
                                                                                  eight[0])))))));
    local_2e8[3] = CONCAT17((0 < sStack_8a) * (sStack_8a < 0x100) * auVar8[0xe] - (0xff < sStack_8a)
                            ,CONCAT16(eight[0]._7_1_,
                                      CONCAT15((0 < sStack_8c) * (sStack_8c < 0x100) * auVar8[0xc] -
                                               (0xff < sStack_8c),
                                               CONCAT14(eight[0]._6_1_,
                                                        CONCAT13((0 < sStack_8e) *
                                                                 (sStack_8e < 0x100) * auVar8[10] -
                                                                 (0xff < sStack_8e),
                                                                 CONCAT12(eight[0]._5_1_,
                                                                          CONCAT11((0 < sStack_90) *
                                                                                   (sStack_90 <
                                                                                   0x100) * auVar8[8
                                                  ] - (0xff < sStack_90),eight[0]._4_1_)))))));
    local_308 = local_318;
    local_318 = ZEXT816(0);
    local_2e8 = local_2e8 + 4;
  }
  return;
}

Assistant:

void av1_upsample_intra_edge_sse4_1(uint8_t *p, int sz) {
  // interpolate half-sample positions
  assert(sz <= 24);

  DECLARE_ALIGNED(16, static const int8_t, kernel[1][16]) = {
    { -1, 9, 9, -1, -1, 9, 9, -1, -1, 9, 9, -1, -1, 9, 9, -1 }
  };

  DECLARE_ALIGNED(
      16, static const int8_t,
      v_const[2][16]) = { { 0, 1, 2, 3, 1, 2, 3, 4, 2, 3, 4, 5, 3, 4, 5, 6 },
                          { 4, 5, 6, 7, 5, 6, 7, 8, 6, 7, 8, 9, 7, 8, 9, 10 } };

  // Extend first/last samples (upper-left p[-1], last p[sz-1])
  // to support 4-tap filter
  p[-2] = p[-1];
  p[sz] = p[sz - 1];

  uint8_t *in = &p[-2];
  uint8_t *out = &p[-2];

  int n = sz + 1;  // Input length including upper-left sample

  __m128i in0 = _mm_lddqu_si128((__m128i *)&in[0]);
  __m128i in16 = _mm_lddqu_si128((__m128i *)&in[16]);

  __m128i coef0 = _mm_lddqu_si128((__m128i *)kernel[0]);
  __m128i shuf0 = _mm_lddqu_si128((__m128i *)v_const[0]);
  __m128i shuf1 = _mm_lddqu_si128((__m128i *)v_const[1]);

  while (n > 0) {
    __m128i in8 = _mm_alignr_epi8(in16, in0, 8);
    __m128i d0 = _mm_shuffle_epi8(in0, shuf0);
    __m128i d1 = _mm_shuffle_epi8(in0, shuf1);
    __m128i d2 = _mm_shuffle_epi8(in8, shuf0);
    __m128i d3 = _mm_shuffle_epi8(in8, shuf1);
    d0 = _mm_maddubs_epi16(d0, coef0);
    d1 = _mm_maddubs_epi16(d1, coef0);
    d2 = _mm_maddubs_epi16(d2, coef0);
    d3 = _mm_maddubs_epi16(d3, coef0);
    d0 = _mm_hadd_epi16(d0, d1);
    d2 = _mm_hadd_epi16(d2, d3);
    __m128i eight = _mm_set1_epi16(8);
    d0 = _mm_add_epi16(d0, eight);
    d2 = _mm_add_epi16(d2, eight);
    d0 = _mm_srai_epi16(d0, 4);
    d2 = _mm_srai_epi16(d2, 4);
    d0 = _mm_packus_epi16(d0, d2);
    __m128i in1 = _mm_alignr_epi8(in16, in0, 1);
    __m128i out0 = _mm_unpacklo_epi8(in1, d0);
    __m128i out1 = _mm_unpackhi_epi8(in1, d0);
    _mm_storeu_si128((__m128i *)&out[0], out0);
    _mm_storeu_si128((__m128i *)&out[16], out1);
    in0 = in16;
    in16 = _mm_setzero_si128();
    out += 32;
    n -= 16;
  }
}